

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::
logAndSetTestResult(RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                    *this,vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                          *results)

{
  TestContext *this_00;
  deUint64 dVar1;
  deUint64 dVar2;
  deUint64 dVar3;
  deUint64 dVar4;
  deUint64 dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong __n;
  RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
  *pRVar10;
  long lVar11;
  long lVar13;
  int precision;
  allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>
  *extraout_RDX;
  size_t __n_00;
  pointer pSVar14;
  pointer pRVar15;
  RenderSampleAnalyzeResult RVar16;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
  mappedResults;
  string local_50;
  pointer pSVar12;
  
  mappedResults.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mappedResults.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mappedResults.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar14 = (results->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar12 = (results->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  __n = ((long)pSVar12 - (long)pSVar14) / 0x50;
  if (pSVar12 != pSVar14) {
    if (__n >> 0x39 != 0) {
      std::__throw_length_error("vector::_M_default_append");
    }
    pRVar10 = (RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
               *)operator_new(__n * 0x40);
    std::
    __uninitialized_default_n_a<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>*,unsigned_long,deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>>
              (pRVar10,__n,extraout_RDX);
    std::
    _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
    ::_M_deallocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
                     *)0x0,(pointer)0x0,__n_00);
    mappedResults.
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar10 + __n;
    pSVar14 = (results->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pSVar12 = (results->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    mappedResults.
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pRVar10;
  }
  lVar11 = (long)pSVar12 - (long)pSVar14;
  pRVar15 = mappedResults.
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (lVar13 = 0; pRVar10 = &pSVar14->result, lVar13 < (int)(lVar11 / 0x50); lVar13 = lVar13 + 1) {
    iVar6 = pRVar10->uploadedDataSize;
    iVar7 = pRVar10->renderDataSize;
    iVar8 = pRVar10->unrelatedDataSize;
    iVar9 = pRVar10->numVertices;
    dVar1 = (pRVar10->duration).uploadDuration;
    dVar2 = (pRVar10->duration).renderDuration;
    dVar3 = (pRVar10->duration).readDuration;
    dVar4 = (pRVar10->duration).totalDuration;
    dVar5 = (pRVar10->duration).fitResponseDuration;
    (pRVar15->duration).renderReadDuration = (pRVar10->duration).renderReadDuration;
    (pRVar15->duration).fitResponseDuration = dVar5;
    (pRVar15->duration).readDuration = dVar3;
    (pRVar15->duration).totalDuration = dVar4;
    (pRVar15->duration).uploadDuration = dVar1;
    (pRVar15->duration).renderDuration = dVar2;
    pRVar15->uploadedDataSize = iVar6;
    pRVar15->renderDataSize = iVar7;
    pRVar15->unrelatedDataSize = iVar8;
    pRVar15->numVertices = iVar9;
    pRVar15 = pRVar15 + 1;
    pSVar14 = (pointer)(pRVar10 + 1);
  }
  mappedResults.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       mappedResults.
       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  RVar16 = analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                     (((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log,&mappedResults);
  this_00 = (this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  if (RVar16.renderRateAtRange < INFINITY) {
    de::floatToString_abi_cxx11_
              (&local_50,(de *)0x2,RVar16.renderRateAtRange * 0.0009765625 * 0.0009765625,precision)
    ;
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_50._M_dataplus._M_p);
  }
  else {
    de::floatToString_abi_cxx11_(&local_50,(de *)0x2,0.0,precision);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_50._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>_>_>
  ::~vector(&mappedResults);
  return;
}

Assistant:

void RenderCase<SampleType>::logAndSetTestResult (const std::vector<SampleResult>& results)
{
	std::vector<RenderSampleResult<SampleType> > mappedResults;

	mapResultsToRenderRateFormat(mappedResults, results);

	{
		const RenderSampleAnalyzeResult	analysis	= analyzeSampleResults(m_testCtx.getLog(), mappedResults);
		const float						rate		= analysis.renderRateAtRange;

		if (rate == std::numeric_limits<float>::infinity())
		{
			// sample times are 1) invalid or 2) timer resolution too low
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(0.0f, 2).c_str());
		}
		else
		{
			// report transfer rate in millions of MiB/s
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(rate / 1024.0f / 1024.0f, 2).c_str());
		}
	}
}